

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * openjtalk_getFullVoicePath(OpenJTalk *oj,char *path,char *buffer)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  char *res2;
  char *temp2;
  char *res;
  char temp [260];
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (in_RSI == (char *)0x0) {
    *(undefined4 *)(in_RDI + 0x678) = 0xc;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RSI != (char *)0x0) && (sVar1 = strlen(in_RSI), sVar1 != 0)) {
      if (in_RDX == 0) {
        *(undefined4 *)(in_RDI + 0x678) = 0xc;
        return (char *)0x0;
      }
      pcVar2 = u8tou8_path(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar2 = make_voice_path((OpenJTalk *)temp._232_8_,(char *)temp._224_8_);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar3 = u8tou8_path(pcVar2,in_stack_fffffffffffffec0);
      free(pcVar2);
      return pcVar3;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getFullVoicePath(OpenJTalk *oj, const char *path, char *buffer)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}
	if (!path)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!path || strlen(path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}

	if (!buffer)
	{
		oj->errorCode = OPENJTALKERROR_BUFFER_IS_NULL;
		return NULL;
	}

	char temp[MAX_PATH];
#if defined(_WIN32)
	char *res = u8tou8_path(path, buffer);
#else
	char *res = u8tou8_path(path, buffer);
#endif
	if (!res)
	{
		return NULL;
	}

	char *temp2 = make_voice_path(oj, temp);
	if (!temp2)
	{
		return NULL;
	}

#if defined(_WIN32)
	char *res2 = u8tou8_path(temp2, buffer);
#else
	char *res2 = u8tou8_path(temp2, buffer);
#endif
	free(temp2);
	return res2;
}